

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

void __thiscall cppurses::Text_display::scroll_up(Text_display *this,size_t n)

{
  size_t sVar1;
  size_t local_18;
  
  sVar1 = 0;
  if (n <= this->top_line_) {
    sVar1 = this->top_line_ - n;
  }
  this->top_line_ = sVar1;
  local_18 = n;
  (*(this->super_Widget)._vptr_Widget[3])();
  sig::
  Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
  ::operator()((Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
                *)(this->scrolled_up).pimpl_.
                  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_18);
  return;
}

Assistant:

void Text_display::scroll_up(std::size_t n) {
    if (n > this->top_line()) {
        top_line_ = 0;
    } else {
        top_line_ -= n;
    }
    this->update();
    scrolled_up(n);
}